

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_IsInst<Js::OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  Var value;
  IsInstInlineCache *inlineCache;
  Var pvVar1;
  
  pvVar1 = *(Var *)(this + (ulong)playout->R1 * 8 + 0x160);
  ValidateRegValue(this,pvVar1,false,true);
  value = *(Var *)(this + (ulong)playout->R2 * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  inlineCache = FunctionBody::GetIsInstInlineCache
                          (*(FunctionBody **)(this + 0x88),playout->inlineCacheIndex);
  pvVar1 = JavascriptOperators::OP_IsInst(pvVar1,value,*(ScriptContext **)(this + 0x78),inlineCache)
  ;
  SetReg<unsigned_int>(this,playout->R0,pvVar1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_IsInst(const unaligned T* playout)
    {
        Var instance = GetReg(playout->R1);
        Var function = GetReg(playout->R2);
        IsInstInlineCache *inlineCache = this->GetIsInstInlineCache(playout->inlineCacheIndex);
        ScriptContext* scriptContext = GetScriptContext();

        Var result = JavascriptOperators::OP_IsInst(instance, function, scriptContext, inlineCache);

#ifdef ENABLE_BASIC_TELEMETRY
        {
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().IsInstanceOf(instance, function, result);
        }
#endif

        SetReg(playout->R0, result);
    }